

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  solution_t sVar1;
  ostream *poVar2;
  _List_base<CCard,_std::allocator<CCard>_> local_a0;
  _List_base<CCard,_std::allocator<CCard>_> local_88;
  undefined1 local_70 [8];
  deck_t first;
  deck_t second;
  allocator<char> local_19;
  
  local_70 = (undefined1  [8])local_70;
  first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size =
       (size_t)&first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size;
  second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)0x0;
  first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)local_70;
  second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)
            first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size;
  read_deck((deck_t *)local_70);
  read_deck((deck_t *)&first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size
           );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size,
             "first player",&local_19);
  dump_deck((string *)
            &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size,
            (deck_t *)local_70);
  std::__cxx11::string::~string
            ((string *)
             &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size,
             "second player",&local_19);
  dump_deck((string *)
            &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size,
            (deck_t *)&first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size
           );
  std::__cxx11::string::~string
            ((string *)
             &second.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size);
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::list
            ((list<CCard,_std::allocator<CCard>_> *)&local_a0,
             (list<CCard,_std::allocator<CCard>_> *)local_70);
  std::__cxx11::list<CCard,_std::allocator<CCard>_>::list
            ((list<CCard,_std::allocator<CCard>_> *)&local_88,
             (list<CCard,_std::allocator<CCard>_> *)
             &first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size);
  sVar1 = solve((deck_t *)&local_a0,(deck_t *)&local_88);
  std::__cxx11::_List_base<CCard,_std::allocator<CCard>_>::_M_clear(&local_88);
  std::__cxx11::_List_base<CCard,_std::allocator<CCard>_>::_M_clear(&local_a0);
  poVar2 = std::operator<<((ostream *)&std::cerr,"solution has been found");
  std::endl<char,std::char_traits<char>>(poVar2);
  if (sVar1.first - 1U < 2) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar1.first);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1.second);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"PAT");
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::_List_base<CCard,_std::allocator<CCard>_>::_M_clear
            ((_List_base<CCard,_std::allocator<CCard>_> *)
             &first.super__List_base<CCard,_std::allocator<CCard>_>._M_impl._M_node._M_size);
  std::__cxx11::_List_base<CCard,_std::allocator<CCard>_>::_M_clear
            ((_List_base<CCard,_std::allocator<CCard>_> *)local_70);
  return 0;
}

Assistant:

int main()
{
    try
    {
    	deck_t first;
    	deck_t second;
    	
    	read_deck(first);
    	read_deck(second);

        dump_deck("first player", first);
        dump_deck("second player", second);
    	
    	solution_t s = solve(first, second);
    	std::cerr << "solution has been found" << std::endl;
    	
    	switch (s.first)
    	{
    	    case 1:
    	    case 2:
    	        std::cout << s.first << " " << s.second << std::endl;
    	        break;
    
            default:	        
    	        std::cout << "PAT" << std::endl;
    	}
    }
    catch (const std::exception& e)
    {
        std::cerr << e.what() << std::endl;
    }
	
	return 0;
}